

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::ExternalCallEventLogEntry_ProcessArgs
               (EventLogEntry *evt,int32 rootDepth,JavascriptFunction *function,Arguments *args,
               bool checkExceptions,UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  ExternalCallEventLogEntry *pEVar2;
  void **ppvVar3;
  Var pvVar4;
  ExternalCallEventLogEntry *callEvt;
  UnlinkableSlabAllocator *alloc_local;
  bool checkExceptions_local;
  Arguments *args_local;
  JavascriptFunction *function_local;
  int32 rootDepth_local;
  EventLogEntry *evt_local;
  
  pEVar2 = GetInlineEventDataAs<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (evt);
  pEVar2->RootNestingDepth = rootDepth;
  pEVar2->ArgCount = (SUB84(args->Info,0) & 0xffffff) + 1;
  ppvVar3 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)pEVar2->ArgCount);
  pEVar2->ArgArray = ppvVar3;
  *pEVar2->ArgArray = function;
  js_memcpy_s(pEVar2->ArgArray + 1,(ulong)(SUB84(args->Info,0) & 0xffffff) << 3,args->Values,
              (ulong)(SUB84(args->Info,0) & 0xffffff) << 3);
  bVar1 = Js::Arguments::HasNewTarget(args);
  if (bVar1) {
    pvVar4 = Js::Arguments::GetNewTarget(args);
    pEVar2->NewTarget = pvVar4;
  }
  else {
    pEVar2->NewTarget = (TTDVar)0x0;
  }
  pEVar2->ReturnValue = (TTDVar)0x0;
  pEVar2->LastNestedEventTime = 0x7fffffffffffffff;
  pEVar2->CheckExceptionStatus = checkExceptions;
  return;
}

Assistant:

void ExternalCallEventLogEntry_ProcessArgs(EventLogEntry* evt, int32 rootDepth, Js::JavascriptFunction* function, const Js::Arguments& args, bool checkExceptions, UnlinkableSlabAllocator& alloc)
        {
            ExternalCallEventLogEntry* callEvt = GetInlineEventDataAs<ExternalCallEventLogEntry, EventKind::ExternalCallTag>(evt);

            callEvt->RootNestingDepth = rootDepth;
            callEvt->ArgCount = args.Info.Count + 1;

            static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

            callEvt->ArgArray = alloc.SlabAllocateArray<TTDVar>(callEvt->ArgCount);
            callEvt->ArgArray[0] = static_cast<TTDVar>(function);
            js_memcpy_s(callEvt->ArgArray + 1, args.Info.Count * sizeof(TTDVar), args.Values, args.Info.Count * sizeof(Js::Var));

            if (args.HasNewTarget())
            {
                callEvt->NewTarget = static_cast<TTDVar>(args.GetNewTarget());
            }
            else
            {
                callEvt->NewTarget = nullptr;
            }

            callEvt->ReturnValue = nullptr;
            callEvt->LastNestedEventTime = TTD_EVENT_MAXTIME;

            callEvt->CheckExceptionStatus = checkExceptions;
        }